

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

int get_refresh_idx(RefFrameMapPair *ref_frame_map_pairs,int update_arf,GF_GROUP *gf_group,
                   int gf_index,int enable_refresh_skip,int cur_frame_disp)

{
  int iVar1;
  bool bVar2;
  int frame_to_skip;
  int i;
  int skip_frame;
  int reference_frame_level;
  int frame_order;
  RefFrameMapPair ref_pair;
  int map_idx;
  int oldest_idx;
  int oldest_frame_order;
  int oldest_arf_idx;
  int oldest_arf_order;
  int arf_count;
  int cur_frame_disp_local;
  int enable_refresh_skip_local;
  int gf_index_local;
  GF_GROUP *gf_group_local;
  int update_arf_local;
  RefFrameMapPair *ref_frame_map_pairs_local;
  int local_4;
  
  arf_count = 0;
  oldest_arf_order = 0x7fffffff;
  oldest_arf_idx = -1;
  oldest_frame_order = 0x7fffffff;
  oldest_idx = -1;
  map_idx = 0;
  do {
    if (7 < map_idx) {
      if ((update_arf == 0) || (arf_count < 3)) {
        if (oldest_idx < 0) {
          if (oldest_arf_idx < 0) {
            if (oldest_idx == -1) {
              local_4 = oldest_arf_idx;
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = oldest_arf_idx;
          }
        }
        else {
          local_4 = oldest_idx;
        }
      }
      else {
        local_4 = oldest_arf_idx;
      }
      return local_4;
    }
    ref_pair.disp_order = ref_frame_map_pairs[map_idx].disp_order;
    if ((ref_pair.disp_order != -1) &&
       (ref_pair.pyr_level = ref_frame_map_pairs[map_idx].pyr_level,
       ref_pair.disp_order <= cur_frame_disp + -3)) {
      if (enable_refresh_skip != 0) {
        bVar2 = false;
        i = 0;
        while( true ) {
          if ((7 < i) || (iVar1 = gf_group->skip_frame_refresh[gf_index][i], iVar1 == -1))
          goto LAB_00711f27;
          if (ref_pair.disp_order == iVar1) break;
          i = i + 1;
        }
        bVar2 = true;
LAB_00711f27:
        if (bVar2) goto LAB_00711f7c;
      }
      if (ref_pair.pyr_level == 1) {
        if (ref_pair.disp_order < oldest_arf_order) {
          oldest_arf_order = ref_pair.disp_order;
          oldest_arf_idx = map_idx;
        }
        arf_count = arf_count + 1;
      }
      else if (ref_pair.disp_order < oldest_frame_order) {
        oldest_frame_order = ref_pair.disp_order;
        oldest_idx = map_idx;
      }
    }
LAB_00711f7c:
    map_idx = map_idx + 1;
  } while( true );
}

Assistant:

static int get_refresh_idx(RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
                           int update_arf, GF_GROUP *gf_group, int gf_index,
                           int enable_refresh_skip, int cur_frame_disp) {
  int arf_count = 0;
  int oldest_arf_order = INT32_MAX;
  int oldest_arf_idx = -1;

  int oldest_frame_order = INT32_MAX;
  int oldest_idx = -1;

  for (int map_idx = 0; map_idx < REF_FRAMES; map_idx++) {
    RefFrameMapPair ref_pair = ref_frame_map_pairs[map_idx];
    if (ref_pair.disp_order == -1) continue;
    const int frame_order = ref_pair.disp_order;
    const int reference_frame_level = ref_pair.pyr_level;
    // Keep future frames and three closest previous frames in output order.
    if (frame_order > cur_frame_disp - 3) continue;

    if (enable_refresh_skip) {
      int skip_frame = 0;
      // Prevent refreshing a frame in gf_group->skip_frame_refresh.
      for (int i = 0; i < REF_FRAMES; i++) {
        int frame_to_skip = gf_group->skip_frame_refresh[gf_index][i];
        if (frame_to_skip == INVALID_IDX) break;
        if (frame_order == frame_to_skip) {
          skip_frame = 1;
          break;
        }
      }
      if (skip_frame) continue;
    }

    // Keep track of the oldest level 1 frame if the current frame is also level
    // 1.
    if (reference_frame_level == 1) {
      // If there are more than 2 level 1 frames in the reference list,
      // discard the oldest.
      if (frame_order < oldest_arf_order) {
        oldest_arf_order = frame_order;
        oldest_arf_idx = map_idx;
      }
      arf_count++;
      continue;
    }

    // Update the overall oldest reference frame.
    if (frame_order < oldest_frame_order) {
      oldest_frame_order = frame_order;
      oldest_idx = map_idx;
    }
  }
  if (update_arf && arf_count > 2) return oldest_arf_idx;
  if (oldest_idx >= 0) return oldest_idx;
  if (oldest_arf_idx >= 0) return oldest_arf_idx;
  if (oldest_idx == -1) {
    assert(arf_count > 2 && enable_refresh_skip);
    return oldest_arf_idx;
  }
  assert(0 && "No valid refresh index found");
  return -1;
}